

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O0

bool double_conversion::IsHexFloatString<char_const*>
               (char *start,char *end,uc16 separator,bool allow_trailing_junk)

{
  bool bVar1;
  byte bVar2;
  byte in_CL;
  char **in_RDI;
  bool saw_digit;
  char *current;
  char **in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  byte in_stack_ffffffffffffffd6;
  uc16 separator_00;
  bool local_1;
  
  separator_00 = (uc16)in_stack_ffffffffffffffd6;
  do {
    bVar1 = isDigit((int)*(char *)in_RDI,0x10);
    if (!bVar1) {
      if (*(char *)in_RDI == '.') {
        bVar1 = Advance<char_const*>
                          (in_RDI,separator_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (bVar1) {
          return false;
        }
        while (bVar1 = isDigit((int)*(char *)in_RDI,0x10), bVar1) {
          separator_00 = CONCAT11(1,(char)separator_00);
          bVar1 = Advance<char_const*>
                            (in_RDI,separator_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8
                            );
          if (bVar1) {
            return false;
          }
        }
      }
      if ((separator_00 & 0x100) == 0) {
        local_1 = false;
      }
      else if ((*(char *)in_RDI == 'p') || (*(char *)in_RDI == 'P')) {
        bVar1 = Advance<char_const*>
                          (in_RDI,separator_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        if (bVar1) {
          local_1 = false;
        }
        else if (((*(char *)in_RDI == '+') || (*(char *)in_RDI == '-')) &&
                (bVar1 = Advance<char_const*>
                                   (in_RDI,separator_00,in_stack_ffffffffffffffd0,
                                    in_stack_ffffffffffffffc8), bVar1)) {
          local_1 = false;
        }
        else {
          bVar1 = isDigit((int)*(char *)in_RDI,10);
          if (bVar1) {
            bVar1 = Advance<char_const*>
                              (in_RDI,separator_00,in_stack_ffffffffffffffd0,
                               in_stack_ffffffffffffffc8);
            if (bVar1) {
              local_1 = true;
            }
            else {
              do {
                bVar1 = isDigit((int)*(char *)in_RDI,10);
                if (!bVar1) {
                  bVar2 = 1;
                  if ((in_CL & 1) == 0) {
                    bVar1 = AdvanceToNonspace<char_const*>
                                      (in_stack_ffffffffffffffc8,(char *)0x857d3e);
                    bVar2 = bVar1 ^ 0xff;
                  }
                  return (bool)(bVar2 & 1);
                }
                bVar1 = Advance<char_const*>
                                  (in_RDI,separator_00,in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffc8);
              } while (!bVar1);
              local_1 = true;
            }
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        local_1 = false;
      }
      return local_1;
    }
    separator_00 = CONCAT11(1,(char)separator_00);
    bVar1 = Advance<char_const*>
                      (in_RDI,separator_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  } while (!bVar1);
  return false;
}

Assistant:

static bool IsHexFloatString(Iterator start,
                             Iterator end,
                             uc16 separator,
                             bool allow_trailing_junk) {
  DOUBLE_CONVERSION_ASSERT(start != end);

  Iterator current = start;

  bool saw_digit = false;
  while (isDigit(*current, 16)) {
    saw_digit = true;
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (*current == '.') {
    if (Advance(&current, separator, 16, end)) return false;
    while (isDigit(*current, 16)) {
      saw_digit = true;
      if (Advance(&current, separator, 16, end)) return false;
    }
  }
  if (!saw_digit) return false;
  if (*current != 'p' && *current != 'P') return false;
  if (Advance(&current, separator, 16, end)) return false;
  if (*current == '+' || *current == '-') {
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (!isDigit(*current, 10)) return false;
  if (Advance(&current, separator, 16, end)) return true;
  while (isDigit(*current, 10)) {
    if (Advance(&current, separator, 16, end)) return true;
  }
  return allow_trailing_junk || !AdvanceToNonspace(&current, end);
}